

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_getaddrinfo.c
# Opt level: O0

void ares_addrinfo_cat_cnames(ares_addrinfo_cname **head,ares_addrinfo_cname *tail)

{
  ares_addrinfo_cname *local_20;
  ares_addrinfo_cname *last;
  ares_addrinfo_cname *tail_local;
  ares_addrinfo_cname **head_local;
  
  local_20 = *head;
  if (local_20 == (ares_addrinfo_cname *)0x0) {
    *head = tail;
  }
  else {
    for (; local_20->next != (ares_addrinfo_cname *)0x0; local_20 = local_20->next) {
    }
    local_20->next = tail;
  }
  return;
}

Assistant:

void ares_addrinfo_cat_cnames(struct ares_addrinfo_cname **head,
                              struct ares_addrinfo_cname  *tail)
{
  struct ares_addrinfo_cname *last = *head;
  if (!last) {
    *head = tail;
    return;
  }

  while (last->next) {
    last = last->next;
  }

  last->next = tail;
}